

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O3

string_view __thiscall
gmlc::utilities::string_viewOps::removeBrackets(string_viewOps *this,string_view str)

{
  byte bVar1;
  undefined1 auVar2 [16];
  ulong uVar4;
  string_view trimCharacters;
  string_view sVar6;
  string_view input;
  size_t sVar3;
  byte *pbVar5;
  
  input._M_str = (char *)str._M_len;
  trimCharacters._M_str = " \t\n\r";
  trimCharacters._M_len = 4;
  input._M_len = (size_t)this;
  sVar6 = trim(input,trimCharacters);
  pbVar5 = (byte *)sVar6._M_str;
  sVar3 = sVar6._M_len;
  if (sVar3 == 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = pbVar5;
    sVar6 = (string_view)(auVar2 << 0x40);
  }
  else {
    bVar1 = *pbVar5;
    if ((((bVar1 - 0x3c < 0x40) &&
         ((0x8000000080000001U >> ((ulong)(bVar1 - 0x3c) & 0x3f) & 1) != 0)) || (bVar1 == 0x28)) &&
       (pbVar5[sVar3 - 1] == pmap[bVar1])) {
      uVar4 = sVar3 - 1;
      if (sVar3 - 2 <= sVar3 - 1) {
        uVar4 = sVar3 - 2;
      }
      sVar6._M_str = (char *)(pbVar5 + 1);
      sVar6._M_len = uVar4;
    }
  }
  return sVar6;
}

Assistant:

std::string_view removeBrackets(std::string_view str)
{
    std::string_view ret = trim(str);
    if (!ret.empty()) {
        if ((ret.front() == '[') || (ret.front() == '(') ||
            (ret.front() == '{') || (ret.front() == '<')) {
            if (static_cast<unsigned char>(ret.back()) == pmap[ret.front()]) {
                return ret.substr(1, ret.size() - 2);
            }
        }
    }
    return ret;
}